

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O2

Node * __thiscall Assimp::ColladaLoader::FindNode(ColladaLoader *this,Node *pNode,string *pName)

{
  pointer ppNVar1;
  __type _Var2;
  Node *pNVar3;
  size_t a;
  ulong uVar4;
  
  _Var2 = std::operator==(&pNode->mName,pName);
  pNVar3 = pNode;
  if ((!_Var2) && (_Var2 = std::operator==(&pNode->mID,pName), !_Var2)) {
    uVar4 = 0;
    do {
      ppNVar1 = (pNode->mChildren).
                super__Vector_base<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(pNode->mChildren).
                        super__Vector_base<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar1 >> 3) <= uVar4) {
        return (Node *)0x0;
      }
      pNVar3 = FindNode(this,ppNVar1[uVar4],pName);
      uVar4 = uVar4 + 1;
    } while (pNVar3 == (Node *)0x0);
  }
  return pNVar3;
}

Assistant:

const Collada::Node* ColladaLoader::FindNode(const Collada::Node* pNode, const std::string& pName) const
{
    if (pNode->mName == pName || pNode->mID == pName)
        return pNode;

    for (size_t a = 0; a < pNode->mChildren.size(); ++a)
    {
        const Collada::Node* node = FindNode(pNode->mChildren[a], pName);
        if (node)
            return node;
    }

    return NULL;
}